

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBvhTriangleMeshShape.cpp
# Opt level: O3

void __thiscall
btBvhTriangleMeshShape::btBvhTriangleMeshShape
          (btBvhTriangleMeshShape *this,btStridingMeshInterface *meshInterface,
          bool useQuantizedAabbCompression,bool buildBvh)

{
  undefined3 in_register_00000009;
  
  btTriangleMeshShape::btTriangleMeshShape(&this->super_btTriangleMeshShape,meshInterface);
  (this->super_btTriangleMeshShape).super_btConcaveShape.super_btCollisionShape.
  _vptr_btCollisionShape = (_func_int **)&PTR__btBvhTriangleMeshShape_0021ce90;
  this->m_bvh = (btOptimizedBvh *)0x0;
  this->m_triangleInfoMap = (btTriangleInfoMap *)0x0;
  this->m_useQuantizedAabbCompression = useQuantizedAabbCompression;
  this->m_ownsBvh = false;
  (this->super_btTriangleMeshShape).super_btConcaveShape.super_btCollisionShape.m_shapeType = 0x15;
  if (CONCAT31(in_register_00000009,buildBvh) != 0) {
    buildOptimizedBvh(this);
  }
  return;
}

Assistant:

btBvhTriangleMeshShape::btBvhTriangleMeshShape(btStridingMeshInterface* meshInterface, bool useQuantizedAabbCompression, bool buildBvh)
:btTriangleMeshShape(meshInterface),
m_bvh(0),
m_triangleInfoMap(0),
m_useQuantizedAabbCompression(useQuantizedAabbCompression),
m_ownsBvh(false)
{
	m_shapeType = TRIANGLE_MESH_SHAPE_PROXYTYPE;
	//construct bvh from meshInterface
#ifndef DISABLE_BVH

	if (buildBvh)
	{
		buildOptimizedBvh();
	}

#endif //DISABLE_BVH

}